

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_gfx_end(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  rf_render_batch *prVar4;
  rf_vertex_buffer *prVar5;
  rf_gfx_color_data_type *prVar6;
  rf_gfx_texcoord_data_type *prVar7;
  bool bVar8;
  rf_context *prVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  prVar9 = rf__ctx;
  prVar4 = (rf__ctx->field_0).current_batch;
  lVar12 = prVar4->current_buffer;
  prVar5 = prVar4->vertex_buffers;
  iVar2 = prVar5[lVar12].v_counter;
  iVar3 = prVar5[lVar12].c_counter;
  uVar10 = iVar2 - iVar3;
  if ((uVar10 != 0) && (uVar10 != 0 && iVar3 <= iVar2)) {
    uVar11 = (ulong)uVar10;
    do {
      prVar4 = (prVar9->field_0).current_batch;
      lVar12 = prVar4->current_buffer;
      prVar5 = prVar4->vertex_buffers;
      prVar6 = prVar5[lVar12].colors;
      lVar12 = (long)prVar5[lVar12].c_counter;
      prVar6[lVar12 * 4] = prVar6[lVar12 * 4 + -4];
      prVar4 = (prVar9->field_0).current_batch;
      lVar12 = prVar4->current_buffer;
      prVar5 = prVar4->vertex_buffers;
      prVar6 = prVar5[lVar12].colors;
      lVar12 = (long)prVar5[lVar12].c_counter;
      prVar6[(long)(int)(lVar12 << 2) + 1] = prVar6[lVar12 * 4 + -3];
      prVar4 = (prVar9->field_0).current_batch;
      lVar12 = prVar4->current_buffer;
      prVar5 = prVar4->vertex_buffers;
      prVar6 = prVar5[lVar12].colors;
      lVar12 = (long)prVar5[lVar12].c_counter;
      prVar6[(long)(int)(lVar12 << 2) + 2] = prVar6[lVar12 * 4 + -2];
      prVar4 = (prVar9->field_0).current_batch;
      lVar12 = prVar4->current_buffer;
      prVar5 = prVar4->vertex_buffers;
      prVar6 = prVar5[lVar12].colors;
      lVar12 = (long)prVar5[lVar12].c_counter;
      prVar6[(long)(int)(lVar12 << 2) + 3] = prVar6[lVar12 * 4 + -1];
      prVar4 = (prVar9->field_0).current_batch;
      piVar1 = &prVar4->vertex_buffers[prVar4->current_buffer].c_counter;
      *piVar1 = *piVar1 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  prVar4 = (prVar9->field_0).current_batch;
  prVar5 = prVar4->vertex_buffers + prVar4->current_buffer;
  iVar2 = prVar5->v_counter;
  uVar10 = iVar2 - prVar5->tc_counter;
  if ((uVar10 != 0) && (uVar10 != 0 && prVar5->tc_counter <= iVar2)) {
    prVar7 = prVar5->texcoords;
    iVar3 = prVar5->tc_counter;
    uVar11 = 0;
    do {
      (prVar7 + (long)iVar3 * 2 + uVar11 * 2)[0] = 0.0;
      (prVar7 + (long)iVar3 * 2 + uVar11 * 2)[1] = 0.0;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
    prVar5->tc_counter = iVar3 + (int)uVar11;
  }
  prVar4->current_depth = prVar4->current_depth + 5e-05;
  if (iVar2 < prVar5->elements_count * 4 + -4) {
    return;
  }
  lVar12 = (long)(prVar9->field_0).stack_counter;
  if (-1 < lVar12) {
    lVar12 = lVar12 + 1;
    do {
      rf_gfx_pop_matrix();
      lVar13 = lVar12 + -1;
      bVar8 = 0 < lVar12;
      lVar12 = lVar13;
    } while (lVar13 != 0 && bVar8);
  }
  rf_gfx_draw();
  return;
}

Assistant:

RF_API void rf_gfx_end()
{
    // Make sure vertex_count is the same for vertices, texcoords, colors and normals
    // NOTE: In OpenGL 1.1, one glColor call can be made for all the subsequent glVertex calls

    // Make sure colors count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter)
    {
        int add_colors = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter;

        for (rf_int i = 0; i < add_colors; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 4];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 1] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 3];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 2] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 2];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 3] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 1];
            rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter++;
        }
    }

    // Make sure texcoords count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter)
    {
        int add_tex_coords = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter;

        for (rf_int i = 0; i < add_tex_coords; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter + 1] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter++;
        }
    }

    // TODO: Make sure normals count match vertex count... if normals support is added in a future... :P

    // NOTE: Depth increment is dependant on rf_gfx_ortho(): z-near and z-far values,
    // as well as depth buffer bit-depth (16bit or 24bit or 32bit)
    // Correct increment formula would be: depthInc = (zfar - znear)/pow(2, bits)
    rf_batch.current_depth += (1.0f/20000.0f);

    // Verify internal buffers limits
    // NOTE: This check is combined with usage of rf_gfx_check_buffer_limit()
    if ((rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter) >= (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4 - 4))
    {
        // WARNING: If we are between rf_gfx_push_matrix() and rf_gfx_pop_matrix() and we need to force a rf_gfx_draw(),
        // we need to call rf_gfx_pop_matrix() before to recover *rf_ctx->gl_ctx.current_matrix (rf_ctx->gl_ctx.modelview) for the next forced draw call!
        // If we have multiple matrix pushed, it will require "rf_ctx->gl_ctx.stack_counter" pops before launching the draw
        for (rf_int i = rf_ctx.stack_counter; i >= 0; i--) rf_gfx_pop_matrix();
        rf_gfx_draw();
    }
}